

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void * luaM_growaux_(lua_State *L,void *block,int *size,size_t size_elems,int limit,char *errormsg)

{
  undefined1 auVar1 [16];
  undefined8 local_58;
  undefined4 local_44;
  int newsize;
  void *newblock;
  char *errormsg_local;
  int limit_local;
  size_t size_elems_local;
  int *size_local;
  void *block_local;
  lua_State *L_local;
  
  if (*size < limit / 2) {
    local_44 = *size << 1;
    if (local_44 < 4) {
      local_44 = 4;
    }
  }
  else {
    local_44 = limit;
    if (limit <= *size) {
      luaG_runerror(L,errormsg,(long)limit % 2 & 0xffffffff);
    }
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = size_elems;
  if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xfffffffffffffffd)) / auVar1,0) <
      (ulong)(long)(local_44 + 1)) {
    local_58 = luaM_toobig(L);
  }
  else {
    local_58 = luaM_realloc_(L,block,(long)*size * size_elems,(long)local_44 * size_elems);
  }
  *size = local_44;
  return local_58;
}

Assistant:

static void*luaM_growaux_(lua_State*L,void*block,int*size,size_t size_elems,
int limit,const char*errormsg){
void*newblock;
int newsize;
if(*size>=limit/2){
if(*size>=limit)
luaG_runerror(L,errormsg);
newsize=limit;
}
else{
newsize=(*size)*2;
if(newsize<4)
newsize=4;
}
newblock=luaM_reallocv(L,block,*size,newsize,size_elems);
*size=newsize;
return newblock;
}